

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O0

string * backend::codegen::format_fn_end_label_abi_cxx11_(string_view function_name)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string *in_RDI;
  stringstream s;
  string *psVar3;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  psVar3 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,".end_");
  __str._M_str = (char *)poVar1;
  __str._M_len = (size_t)psVar3;
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_RDI,__str);
  std::operator<<(pbVar2,"$");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return psVar3;
}

Assistant:

inline std::string format_fn_end_label(std::string_view function_name) {
  auto s = std::stringstream();
  s << ".end_" << function_name << "$";
  return s.str();
}